

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

void __thiscall duckdb_re2::Compiler::AddSuffix(Compiler *this,int id)

{
  uint32_t root;
  uint uVar1;
  
  if (this->failed_ == false) {
    root = (this->rune_range_).begin;
    uVar1 = id;
    if (root != 0) {
      if (this->encoding_ == kEncodingUTF8) {
        uVar1 = AddSuffixRecursive(this,root,id);
      }
      else {
        uVar1 = AllocInst(this,1);
        if ((int)uVar1 < 0) {
          uVar1 = 0;
        }
        else {
          Prog::Inst::InitAlt((this->inst_).ptr_._M_t.
                              super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                              .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl +
                              uVar1,(this->rune_range_).begin,id);
        }
      }
    }
    (this->rune_range_).begin = uVar1;
  }
  return;
}

Assistant:

void Compiler::AddSuffix(int id) {
  if (failed_)
    return;

  if (rune_range_.begin == 0) {
    rune_range_.begin = id;
    return;
  }

  if (encoding_ == kEncodingUTF8) {
    // Build a trie in order to reduce fanout.
    rune_range_.begin = AddSuffixRecursive(rune_range_.begin, id);
    return;
  }

  int alt = AllocInst(1);
  if (alt < 0) {
    rune_range_.begin = 0;
    return;
  }
  inst_[alt].InitAlt(rune_range_.begin, id);
  rune_range_.begin = alt;
}